

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_textedit_paste(nk_text_edit *state,char *ctext,int len)

{
  int length;
  int iVar1;
  char *text;
  int glyphs;
  int len_local;
  char *ctext_local;
  nk_text_edit *state_local;
  
  if (state->mode == '\0') {
    state_local._4_4_ = 0;
  }
  else {
    nk_textedit_clamp(state);
    nk_textedit_delete_selection(state);
    length = nk_utf_len(ctext,len);
    iVar1 = nk_str_insert_text_char(&state->string,state->cursor,ctext,len);
    if (iVar1 == 0) {
      if ((state->undo).undo_point != 0) {
        (state->undo).undo_point = (state->undo).undo_point + -1;
      }
      state_local._4_4_ = 0;
    }
    else {
      nk_textedit_makeundo_insert(state,state->cursor,length);
      state->cursor = len + state->cursor;
      state->has_preferred_x = '\0';
      state_local._4_4_ = 1;
    }
  }
  return state_local._4_4_;
}

Assistant:

NK_API int
nk_textedit_paste(struct nk_text_edit *state, char const *ctext, int len)
{
    /* API paste: replace existing selection with passed-in text */
    int glyphs;
    const char *text = (const char *) ctext;
    if (state->mode == NK_TEXT_EDIT_MODE_VIEW) return 0;

    /* if there's a selection, the paste should delete it */
    nk_textedit_clamp(state);
    nk_textedit_delete_selection(state);

    /* try to insert the characters */
    glyphs = nk_utf_len(ctext, len);
    if (nk_str_insert_text_char(&state->string, state->cursor, text, len)) {
        nk_textedit_makeundo_insert(state, state->cursor, glyphs);
        state->cursor += len;
        state->has_preferred_x = 0;
        return 1;
    }
    /* remove the undo since we didn't actually insert the characters */
    if (state->undo.undo_point)
        --state->undo.undo_point;
    return 0;
}